

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmparse.c
# Opt level: O2

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  yysymbol_kind_t yVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  char *__s;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *yyres;
  int iVar12;
  long lVar13;
  yysymbol_kind_t yyarg [5];
  
  yVar2 = yyctx->yytoken;
  __s = "syntax error";
  uVar10 = 0;
  if (yVar2 == YYSYMBOL_YYEMPTY) {
    uVar9 = 0;
  }
  else {
    iVar12 = (int)yypact[*yyctx->yyssp];
    uVar9 = 1;
    yyarg[0] = yVar2;
    if (iVar12 != -0x21) {
      iVar6 = -iVar12;
      iVar8 = 0x2e;
      if (0xbb - iVar12 < 0x2e) {
        iVar8 = 0xbb - iVar12;
      }
      uVar3 = 0;
      uVar11 = (long)iVar12;
      if ((long)iVar12 < 1) {
        uVar11 = uVar3;
      }
      for (; iVar12 = (int)uVar3, (long)((long)iVar6 + uVar11) < (long)iVar8; uVar11 = uVar11 + 1) {
        if (((long)iVar6 + uVar11 != 1) &&
           (iVar6 + (int)uVar11 ==
            (uint)"\x16!\n\x10\x17\x18\x19\x1a\x1b\x05\x17\x18\x19\x1a\x1b\x17\x18\x19\x1a\x1b\b\x10\n\x03\x04\x05\x06"
                  [uVar11])) {
          if (iVar12 == 4) {
            __s = "syntax error, unexpected %s";
            goto switchD_00109037_caseD_fffffffe;
          }
          uVar3 = (ulong)(iVar12 + 1);
          yyarg[(long)iVar12 + 1] =
               (uint)"\x16!\n\x10\x17\x18\x19\x1a\x1b\x05\x17\x18\x19\x1a\x1b\x17\x18\x19\x1a\x1b\b\x10\n\x03\x04\x05\x06"
                     [uVar11];
        }
      }
      if (iVar12 == -2) {
        return -2;
      }
      if (iVar12 != 0) {
        uVar9 = iVar12 + 1;
        switch(iVar12) {
        case 1:
          __s = "syntax error, unexpected %s, expecting %s";
          uVar9 = 2;
          break;
        case 2:
          __s = "syntax error, unexpected %s, expecting %s or %s";
          uVar9 = 3;
          break;
        case 3:
          __s = "syntax error, unexpected %s, expecting %s or %s or %s";
          uVar9 = 4;
          break;
        case 4:
          __s = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
          uVar9 = 5;
          break;
        case -3:
          return -2;
        }
        goto switchD_00109037_caseD_fffffffe;
      }
    }
    yyarg[1] = YYSYMBOL_YYEMPTY;
    __s = "syntax error, unexpected %s";
  }
switchD_00109037_caseD_fffffffe:
  sVar4 = strlen(__s);
  lVar13 = (sVar4 - (long)(int)(uVar9 * 2)) + 1;
  uVar11 = 0;
  if (0 < (int)uVar9) {
    uVar11 = (ulong)uVar9;
  }
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    lVar5 = yytnamerr((char *)0x0,yytname[yyarg[uVar10]]);
    if (lVar5 < 0) {
      return -2;
    }
    lVar13 = lVar13 + lVar5;
  }
  if (*yymsg_alloc < lVar13) {
    lVar5 = lVar13 * 2;
    lVar7 = 0x7fffffffffffffff;
    if (lVar13 == lVar5 || SBORROW8(lVar13,lVar5) != 0 < lVar13) {
      lVar7 = lVar5;
    }
    *yymsg_alloc = lVar7;
    return -1;
  }
  yyres = *yymsg;
  iVar12 = 0;
  lVar13 = 1;
  do {
    cVar1 = *__s;
    *yyres = cVar1;
    lVar5 = lVar13;
    lVar7 = lVar13;
    if (cVar1 == '%') {
      if ((__s[1] == 's') && (iVar12 < (int)uVar9)) {
        lVar5 = (long)iVar12;
        iVar12 = iVar12 + 1;
        lVar5 = yytnamerr(yyres,yytname[yyarg[lVar5]]);
        lVar7 = 2;
      }
    }
    else if (cVar1 == '\0') {
      return 0;
    }
    yyres = yyres + lVar5;
    __s = __s + lVar7;
  } while( true );
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}